

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_imexgus.c
# Opt level: O0

SUNErrCode
SUNAdaptController_SetParams_ImExGus
          (SUNAdaptController C,sunrealtype k1e,sunrealtype k2e,sunrealtype k1i,sunrealtype k2i)

{
  SUNContext_conflict sunctx_local_scope_;
  sunrealtype k2i_local;
  sunrealtype k1i_local;
  sunrealtype k2e_local;
  sunrealtype k1e_local;
  SUNAdaptController C_local;
  
  *(sunrealtype *)((long)C->content + 0x10) = k1e;
  *(sunrealtype *)((long)C->content + 0x18) = k2e;
  *(sunrealtype *)C->content = k1i;
  *(sunrealtype *)((long)C->content + 8) = k2i;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_SetParams_ImExGus(SUNAdaptController C,
                                                sunrealtype k1e, sunrealtype k2e,
                                                sunrealtype k1i, sunrealtype k2i)
{
  SUNFunctionBegin(C->sunctx);
  SACIMEXGUS_K1E(C) = k1e;
  SACIMEXGUS_K2E(C) = k2e;
  SACIMEXGUS_K1I(C) = k1i;
  SACIMEXGUS_K2I(C) = k2i;
  return SUN_SUCCESS;
}